

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O2

int __thiscall
Saturation::PredicateSplitPassiveClauseContainer::remove
          (PredicateSplitPassiveClauseContainer *this,char *__filename)

{
  __uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  _Var1;
  uint uVar2;
  int extraout_EAX;
  pointer puVar3;
  float featureValue;
  
  (*(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
    _vptr_ClauseContainer[0x14])();
  uVar2 = bestQueue(this,featureValue);
  if (this->_layeredArrangement == true) {
    while( true ) {
      puVar3 = (this->_queues).
               super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_queues).
                        super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <=
          (ulong)uVar2) break;
      _Var1._M_t.
      super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
      .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
           puVar3[uVar2]._M_t.
           super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
           ._M_t;
      (**(code **)(*(long *)_Var1._M_t.
                            super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                            .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                            _M_head_impl + 0x20))
                (_Var1._M_t.
                 super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                 .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl,
                 __filename);
      uVar2 = uVar2 + 1;
    }
  }
  else {
    _Var1._M_t.
    super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
    .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
         (this->_queues).
         super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
         super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
         ._M_t;
    puVar3 = (pointer)(**(code **)(*(long *)_Var1._M_t.
                                            super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                            .
                                            super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                            ._M_head_impl + 0x20))
                                (_Var1._M_t.
                                 super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                 .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                 ._M_head_impl,__filename);
  }
  if ((this->super_PassiveClauseContainer)._isOutermost == true) {
    Lib::SingleParamEvent<Kernel::Clause_*>::fire
              (&(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
                super_ClauseContainer.removedEvent,(Clause *)__filename);
    return extraout_EAX;
  }
  return (int)puVar3;
}

Assistant:

void PredicateSplitPassiveClauseContainer::remove(Clause* cl)
{
  if (_isOutermost)
  {
    ASS(cl->store()==Clause::PASSIVE);
  }
  auto bestQueueIndex = bestQueue(evaluateFeature(cl));

  if (_layeredArrangement)
  {
    // remove clause from all queues starting from best queue for clause
    for (unsigned i = bestQueueIndex; i < _queues.size(); i++)
    {
      _queues[i]->remove(cl);
    }
  }
  else
  {
    // remove clause from best queue for clause
    _queues[bestQueueIndex]->remove(cl);
  }

  if (_isOutermost)
  {
    ASS(cl->store()==Clause::PASSIVE);
    removedEvent.fire(cl);
    ASS(cl->store() != Clause::PASSIVE);
  }
}